

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

void helics::BrokerFactory::displayHelp(CoreType type)

{
  element_type *peVar1;
  int in_EDI;
  shared_ptr<helics::Broker> brk_1;
  shared_ptr<helics::Broker> brk;
  shared_ptr<helics::Broker> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  CoreType in_stack_ffffffffffffff0c;
  string_view in_stack_ffffffffffffff10;
  
  if ((in_EDI == 0) || (in_EDI == 0x16)) {
    std::operator<<((ostream *)&std::cout,"All core types have similar options\n");
    std::__cxx11::string::string(in_stack_fffffffffffffee0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    makeBroker(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    peVar1 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4f88b0);
    (*peVar1->_vptr_Broker[8])(peVar1,6,"--help");
    std::__cxx11::string::string(in_stack_fffffffffffffee0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    makeBroker(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff10);
    CLI::std::shared_ptr<helics::Broker>::operator=
              ((shared_ptr<helics::Broker> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x4f8956);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    peVar1 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4f896d);
    (*peVar1->_vptr_Broker[8])(peVar1,6,"--help");
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x4f89a7);
  }
  else {
    std::__cxx11::string::string(in_stack_fffffffffffffee0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_EDI,in_stack_fffffffffffffed0));
    makeBroker(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_EDI,in_stack_fffffffffffffed0));
    peVar1 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4f8a75);
    (*peVar1->_vptr_Broker[8])(peVar1,6,"--help");
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x4f8aa3);
  }
  return;
}

Assistant:

void displayHelp(CoreType type)
{
    if (type == CoreType::DEFAULT || type == CoreType::UNRECOGNIZED) {
        std::cout << "All core types have similar options\n";
        auto brk = makeBroker(CoreType::DEFAULT, std::string{});
        brk->configure(helpStr);
#ifdef HELICS_ENABLE_TCP_CORE
        brk = makeBroker(CoreType::TCP_SS, std::string{});
        brk->configure(helpStr);
#endif
    } else {
        auto brk = makeBroker(type, std::string{});
        brk->configure(helpStr);
    }
}